

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetRegistrarHostname
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aHostname)

{
  bool bVar1;
  element_type *peVar2;
  Error *pEVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view fmt;
  format_args args;
  anon_class_1_0_00000001 local_272;
  v10 local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  char *local_268;
  string local_260;
  Error local_240;
  ErrorCode local_214;
  Error local_210;
  ErrorCode local_1e4;
  Error local_1e0;
  undefined1 local_1a8 [8];
  BbrDataset bbrDatasetWithRegAddr;
  BbrDataset bbrDataset;
  string *aHostname_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  char *local_88;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  bbrDataset._103_1_ = 0;
  Error::Error(__return_storage_ptr__);
  BbrDataset::BbrDataset((BbrDataset *)&bbrDatasetWithRegAddr.mPresentFlags);
  BbrDataset::BbrDataset((BbrDataset *)local_1a8);
  std::__cxx11::string::operator=
            ((string *)(bbrDataset.mTriHostname.field_2._M_local_buf + 8),(string *)aHostname);
  bbrDataset.mRegistrarIpv6Addr.field_2._8_2_ = bbrDataset.mRegistrarIpv6Addr.field_2._8_2_ | 0x4000
  ;
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mCommissioner);
  (*peVar2->_vptr_Commissioner[0x16])(&local_1e0,peVar2,&bbrDatasetWithRegAddr.mPresentFlags);
  pEVar3 = Error::operator=(__return_storage_ptr__,&local_1e0);
  local_1e4 = kNone;
  bVar1 = commissioner::operator!=(pEVar3,&local_1e4);
  Error::~Error(&local_1e0);
  if (!bVar1) {
    peVar2 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar2->_vptr_Commissioner[0x18])(&local_210,peVar2,local_1a8,0x2000);
    pEVar3 = Error::operator=(__return_storage_ptr__,&local_210);
    local_214 = kNone;
    bVar1 = commissioner::operator!=(pEVar3,&local_214);
    Error::~Error(&local_210);
    if (!bVar1) {
      if ((bbrDatasetWithRegAddr.mRegistrarIpv6Addr.field_2._8_2_ & 0x2000) == 0) {
        SetRegistrarHostname::anon_class_1_0_00000001::operator()(&local_272);
        local_58 = &local_270;
        local_60 = &local_271;
        bVar4 = ::fmt::v10::operator()(local_60);
        local_268 = (char *)bVar4.size_;
        local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar4.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_68 = &local_260;
        local_78 = local_270;
        pcStack_70 = local_268;
        local_50 = &local_78;
        local_90 = local_270;
        local_88 = local_268;
        local_80 = aHostname;
        local_48 = local_90;
        pcStack_40 = local_88;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                   ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)aHostname,(v10 *)local_68,local_270);
        local_30 = local_a0;
        local_38 = &error;
        local_20 = 0xd;
        fmt.size_ = 0xd;
        fmt.data_ = local_88;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)local_38;
        local_28 = local_38;
        local_18 = local_30;
        local_10 = local_38;
        ::fmt::v10::vformat_abi_cxx11_(&local_260,(v10 *)local_90,fmt,args);
        Error::Error(&local_240,kBadFormat,&local_260);
        Error::operator=(__return_storage_ptr__,&local_240);
        Error::~Error(&local_240);
        std::__cxx11::string::~string((string *)&local_260);
      }
      else {
        MergeDataset(&this->mBbrDataset,(BbrDataset *)&bbrDatasetWithRegAddr.mPresentFlags);
        MergeDataset(&this->mBbrDataset,(BbrDataset *)local_1a8);
      }
    }
  }
  bbrDataset._103_1_ = 1;
  BbrDataset::~BbrDataset((BbrDataset *)local_1a8);
  BbrDataset::~BbrDataset((BbrDataset *)&bbrDatasetWithRegAddr.mPresentFlags);
  if ((bbrDataset._103_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetRegistrarHostname(const std::string &aHostname)
{
    Error      error;
    BbrDataset bbrDataset;
    BbrDataset bbrDatasetWithRegAddr;

    bbrDataset.mRegistrarHostname = aHostname;
    bbrDataset.mPresentFlags |= BbrDataset::kRegistrarHostnameBit;

    SuccessOrExit(error = mCommissioner->SetBbrDataset(bbrDataset));
    SuccessOrExit(error = mCommissioner->GetBbrDataset(bbrDatasetWithRegAddr, BbrDataset::kRegistrarIpv6AddrBit));
    VerifyOrExit(bbrDatasetWithRegAddr.mPresentFlags & BbrDataset::kRegistrarIpv6AddrBit,
                 error = ERROR_BAD_FORMAT("cannot resolve the Registrar Hostname: {}", aHostname));

    MergeDataset(mBbrDataset, bbrDataset);
    MergeDataset(mBbrDataset, bbrDatasetWithRegAddr);

exit:
    return error;
}